

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Palette::addColor(Palette *this,uint16_t color)

{
  uint16_t uVar1;
  size_t i;
  
  i = 0;
  while( true ) {
    uVar1 = (this->colors)._M_elems[i];
    if (uVar1 == color) {
      return;
    }
    if (uVar1 == 0xffff) break;
    i = i + 1;
    if (i == 4) {
      __assert_fail("i < colors.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/main.cpp"
                    ,0x31e,"addColor");
    }
  }
  (this->colors)._M_elems[i] = color;
  return;
}

Assistant:

void Palette::addColor(uint16_t color) {
	for (size_t i = 0; true; ++i) {
		assert(i < colors.size()); // The packing should guarantee this
		if (colors[i] == color) { // The color is already present
			break;
		} else if (colors[i] == UINT16_MAX) { // Empty slot
			colors[i] = color;
			break;
		}
	}
}